

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# append_data.hpp
# Opt level: O2

void duckdb::ResizeValidity(ArrowBuffer *buffer,idx_t row_count)

{
  ArrowBuffer::resize(buffer,row_count + 7 >> 3,0xff);
  return;
}

Assistant:

static void ResizeValidity(ArrowBuffer &buffer, idx_t row_count) {
	auto byte_count = (row_count + 7) / 8;
	buffer.resize(byte_count, 0xFF);
}